

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_multi.hpp
# Opt level: O3

unique_ptr<Kaaa,_std::default_delete<Kaaa>_> __thiscall
Infector::Container::build_delegate<Kaaa>(Container *this)

{
  iterator iVar1;
  iterator iVar2;
  __buckets_ptr pp_Var3;
  undefined8 *puVar4;
  long in_RSI;
  pointer_____offset_0x10___ *ppuVar5;
  key_type local_18;
  
  local_18._M_target = (type_info *)&Kaaa::typeinfo;
  iVar1 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(in_RSI + 0x38),&local_18);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
      ._M_cur == (__node_type *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__exception_001817c8;
    ppuVar5 = &ExBuildWhat::typeinfo;
  }
  else if (*(char *)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                           ._M_cur + 0x18) == '\x01') {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__exception_00181808;
    ppuVar5 = &ExSingleMulti::typeinfo;
  }
  else {
    iVar2 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(in_RSI + 0x70),
                   (key_type *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                          ._M_cur + 0x10));
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_18._M_target = (type_info *)0x0;
      if (*(long *)((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                          ._M_cur + 0x20) != 0) {
        pp_Var3 = (__buckets_ptr)
                  (**(code **)((long)iVar2.
                                     super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                                     ._M_cur + 0x28))
                            ((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                                   ._M_cur + 0x10,&local_18);
        (this->singleIstances)._M_h._M_buckets = pp_Var3;
        return (__uniq_ptr_data<Kaaa,_std::default_delete<Kaaa>,_true,_true>)
               (__uniq_ptr_data<Kaaa,_std::default_delete<Kaaa>,_true,_true>)this;
      }
      std::__throw_bad_function_call();
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__exception_00181848;
    ppuVar5 = &ExNotWired::typeinfo;
  }
  __cxa_throw(puVar4,ppuVar5,std::exception::~exception);
}

Assistant:

std::unique_ptr<T> Container::build_delegate(){
        auto it = typeMap.find( std::type_index(typeid(T)) );
        if( it==typeMap.end())
            launch_exception<ExBuildWhat>(); // TYPE NOT REGISTERED

        if( it->second.single == true) ///!!!!!
            launch_exception<ExSingleMulti>(); // T must be multi

        auto it2 = callbacks.find( it->second.type ); //find constructor

        if( it2==callbacks.end() )
            launch_exception<ExNotWired>(); // CONSTRUCTOR NOT WIRED

        return std::move(
                    std::unique_ptr<T>(reinterpret_cast<T*>( (it2->second)(nullptr) ))
                    );
    }